

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReproduceListener.cpp
# Opt level: O2

void __thiscall rc::detail::ReproduceListener::~ReproduceListener(ReproduceListener *this)

{
  ostream *poVar1;
  string local_30;
  
  (this->super_TestListenerAdapter).super_TestListener._vptr_TestListener =
       (_func_int **)&PTR_onTestCaseFinished_001a84b0;
  if ((this->m_reproduceMap)._M_h._M_element_count != 0) {
    poVar1 = std::operator<<(this->m_out,"Some of your RapidCheck properties had failures. To ");
    poVar1 = std::operator<<(poVar1,"reproduce these, run with:");
    poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
    poVar1 = std::operator<<(poVar1,"RC_PARAMS=\"reproduce=");
    reproduceMapToString(&local_30,&this->m_reproduceMap);
    poVar1 = std::operator<<(poVar1,(string *)&local_30);
    poVar1 = std::operator<<(poVar1,"\"");
    std::endl<char,std::char_traits<char>>(poVar1);
    std::__cxx11::string::~string((string *)&local_30);
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_rc::detail::Reproduce>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_rc::detail::Reproduce>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&(this->m_reproduceMap)._M_h);
  return;
}

Assistant:

ReproduceListener::~ReproduceListener() {
  if (m_reproduceMap.empty()) {
    return;
  }

  m_out << "Some of your RapidCheck properties had failures. To "
        << "reproduce these, run with:" << std::endl
        << "RC_PARAMS=\"reproduce=" << reproduceMapToString(m_reproduceMap)
        << "\"" << std::endl;
}